

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_find_polygon_degeneracies.cc
# Opt level: O0

vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_> *
s2builderutil::FindPolygonDegeneracies
          (vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
           *__return_storage_ptr__,Graph *g,S2Error *error)

{
  DegenerateEdges DVar1;
  SiblingPairs SVar2;
  GraphOptions *pGVar3;
  DegeneracyFinder local_f0;
  S2Error *local_20;
  S2Error *error_local;
  Graph *g_local;
  
  local_20 = error;
  error_local = (S2Error *)g;
  g_local = (Graph *)__return_storage_ptr__;
  anon_unknown_0::CheckGraphOptions(g);
  pGVar3 = S2Builder::Graph::options((Graph *)error_local);
  DVar1 = S2Builder::GraphOptions::degenerate_edges(pGVar3);
  if (DVar1 == DISCARD) {
    pGVar3 = S2Builder::Graph::options((Graph *)error_local);
    SVar2 = S2Builder::GraphOptions::sibling_pairs(pGVar3);
    if (SVar2 == DISCARD) {
      memset(__return_storage_ptr__,0,0x18);
      std::
      vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>::
      vector(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
  }
  anon_unknown_0::DegeneracyFinder::DegeneracyFinder(&local_f0,(Graph *)error_local);
  anon_unknown_0::DegeneracyFinder::Run(__return_storage_ptr__,&local_f0,local_20);
  anon_unknown_0::DegeneracyFinder::~DegeneracyFinder(&local_f0);
  return __return_storage_ptr__;
}

Assistant:

vector<PolygonDegeneracy> FindPolygonDegeneracies(const Graph& g,
                                                  S2Error* error) {
  CheckGraphOptions(g);
  if (g.options().degenerate_edges() == DegenerateEdges::DISCARD &&
      g.options().sibling_pairs() == SiblingPairs::DISCARD) {
    return {};  // All degeneracies have already been discarded.
  }
  return DegeneracyFinder(&g).Run(error);
}